

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O2

void __thiscall front::syntax::SyntaxAnalyze::gm_stmt(SyntaxAnalyze *this)

{
  bool bVar1;
  WhileLabels WVar2;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  undefined1 local_70 [48];
  undefined1 local_40;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  
  bVar1 = try_word(this,1,LBRACE);
  if (bVar1) {
    gm_block(this);
    return;
  }
  bVar1 = try_word(this,1,IFTK);
  if (bVar1) {
    gm_if_stmt(this);
    return;
  }
  bVar1 = try_word(this,1,WHILETK);
  if (bVar1) {
    gm_while_stmt_flat(this);
    return;
  }
  bVar1 = try_word(this,1,BREAK);
  if (bVar1) {
    match_one_word(this,BREAK);
    match_one_word(this,SEMICN);
    WVar2 = irGenerator::irGenerator::checkWhile(&this->irGenerator);
    local_38._M_engaged = false;
    irGenerator::irGenerator::ir_jump
              (&this->irGenerator,Br,WVar2._endLabel,-1,
               (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_38,Loop);
    this_00 = &local_38;
  }
  else {
    bVar1 = try_word(this,1,CONTINUETK);
    if (!bVar1) {
      bVar1 = try_word(this,1,RETURNTK);
      if (bVar1) {
        gm_return_stmt(this);
        return;
      }
      bVar1 = find_word(this,ASSIGN,SEMICN);
      if (!bVar1) {
        bVar1 = try_word(this,1,SEMICN);
        if (!bVar1) {
          gm_exp((SyntaxAnalyze *)local_70);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_70 + 8));
          match_one_word(this,SEMICN);
          return;
        }
        match_one_word(this,SEMICN);
        return;
      }
      gm_assign_stmt(this);
      return;
    }
    match_one_word(this,CONTINUETK);
    match_one_word(this,SEMICN);
    WVar2 = irGenerator::irGenerator::checkWhile(&this->irGenerator);
    local_40 = 0;
    irGenerator::irGenerator::ir_jump
              (&this->irGenerator,Br,WVar2._beginLabel,-1,
               (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)(local_70 + 0x10),Loop);
    this_00 = (_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)(local_70 + 0x10);
  }
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_reset(this_00);
  return;
}

Assistant:

void SyntaxAnalyze::gm_stmt() {
  if (try_word(1, Token::LBRACE)) {
    gm_block();
  } else if (try_word(1, Token::IFTK)) {
    gm_if_stmt();
  } else if (try_word(1, Token::WHILETK)) {
    gm_while_stmt();
  } else if (try_word(1, Token::BREAK)) {
    match_one_word(Token::BREAK);
    match_one_word(Token::SEMICN);

    irGenerator.ir_jump(mir::inst::JumpInstructionKind::Br,
                        irGenerator.checkWhile()._endLabel, -1, std::nullopt,
                        mir::inst::JumpKind::Loop);
  } else if (try_word(1, Token::CONTINUETK)) {
    match_one_word(Token::CONTINUETK);
    match_one_word(Token::SEMICN);

    irGenerator.ir_jump(mir::inst::JumpInstructionKind::Br,
                        irGenerator.checkWhile()._beginLabel, -1, std::nullopt,
                        mir::inst::JumpKind::Loop);
  } else if (try_word(1, Token::RETURNTK)) {
    gm_return_stmt();
  } else if (find_word(Token::ASSIGN, Token::SEMICN)) {
    gm_assign_stmt();
  } else if (!try_word(1, Token::SEMICN)) {
    gm_exp();
    match_one_word(Token::SEMICN);
  } else {
    match_one_word(Token::SEMICN);
  }
}